

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::pid_formatter<spdlog::details::null_scoped_padder>::format
          (pid_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  null_scoped_padder local_31;
  uint local_30;
  uint uStack_2c;
  null_scoped_padder p;
  uint field_size;
  uint32_t pid;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *param_1_local;
  pid_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  uStack_2c = os::pid();
  local_30 = null_scoped_padder::count_digits<unsigned_int>(uStack_2c);
  null_scoped_padder::null_scoped_padder
            (&local_31,(ulong)local_30,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::append_int<unsigned_int>(uStack_2c,dest);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }